

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcsrc.cpp
# Opt level: O3

CTcSrcFile *
CTcSrcFile::open_source
          (char *filename,CResLoader *res_loader,char *default_charset,int *charset_error,
          int *default_charset_error)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  FILE *__stream;
  long __off;
  size_t sVar7;
  CTcSrcFile *pCVar8;
  CCharmapToUni *pCVar9;
  CVmDataSource *pCVar10;
  char **ppcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  char buf [275];
  char local_148 [3];
  undefined5 uStack_145;
  char cStack_140;
  undefined2 uStack_13f;
  char local_13d;
  char local_13c [10];
  char acStack_132 [258];
  
  *charset_error = 0;
  *default_charset_error = 0;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    return (CTcSrcFile *)0x0;
  }
  __off = ftell(__stream);
  sVar7 = fread(local_148,1,0x113,__stream);
  if ((((2 < sVar7) && (local_148[0] == -0x11)) && (local_148[1] == -0x45)) &&
     (local_148[2] == -0x41)) {
    uVar17 = 3;
    if ((sVar7 - 0xd < 0xfffffffffffffff6) &&
       (local_13d == ' ' &&
        CONCAT26(uStack_13f,CONCAT15(cStack_140,uStack_145)) == 0x7465737261686323)) {
      lVar15 = 0;
      do {
        if ((local_13c[lVar15] != ' ') && (local_13c[lVar15] != '\t')) {
          if ((sVar7 - lVar15) - 0xc < 7) {
            if (sVar7 - 0x12 != lVar15) break;
          }
          else {
            iVar6 = memicmp(local_13c + lVar15,"\"utf-8\"",7);
            if (iVar6 == 0) {
              uVar17 = lVar15 + 0x13;
              break;
            }
          }
          iVar6 = memicmp(local_13c + lVar15,"\"utf8\"",6);
          if (iVar6 == 0) {
            uVar17 = lVar15 + 0x12;
          }
          break;
        }
        lVar15 = lVar15 + 1;
      } while (sVar7 - 0xc != lVar15);
    }
    fseek(__stream,(uVar17 & 0xffffffff) + __off,0);
    pCVar8 = (CTcSrcFile *)operator_new(0x430);
    pCVar9 = (CCharmapToUni *)operator_new(0x10);
    (pCVar9->super_CCharmap)._vptr_CCharmap = (_func_int **)0x0;
    *(undefined8 *)&(pCVar9->super_CCharmap).ref_cnt_ = 0;
    (pCVar9->super_CCharmap).ref_cnt_ = 1;
    (pCVar9->super_CCharmap)._vptr_CCharmap = (_func_int **)&PTR__CCharmap_0030a7a8;
    (pCVar8->super_CTcSrcObject)._vptr_CTcSrcObject = (_func_int **)&PTR__CTcSrcFile_003140d0;
    pCVar10 = (CVmDataSource *)operator_new(0x10);
    goto LAB_00208f08;
  }
  if (1 < sVar7) {
    bVar3 = local_148[1] == -2;
    bVar4 = local_148[0] == -1;
    if (bVar3 && bVar4) {
      pCVar8 = (CTcSrcFile *)operator_new(0x430);
      pCVar9 = (CCharmapToUni *)operator_new(0x210);
      iVar6 = 0;
      memset(pCVar9,0,0x210);
      (pCVar9->super_CCharmap).ref_cnt_ = 1;
      (pCVar9->super_CCharmap)._vptr_CCharmap = (_func_int **)&PTR__CCharmap_0030a810;
      (pCVar8->super_CTcSrcObject)._vptr_CTcSrcObject = (_func_int **)&PTR__CTcSrcFile_003140d0;
      pCVar10 = (CVmDataSource *)operator_new(0x10);
      ppcVar11 = open_source::names;
    }
    else {
      if (local_148[1] != -1 || local_148[0] != -2) {
        if ((8 < sVar7) &&
           (sVar7 != 9 &&
            (cStack_140 == ' ' &&
            CONCAT53(uStack_145,CONCAT12(local_148[2],CONCAT11(local_148[1],local_148[0]))) ==
            0x7465737261686323))) {
          lVar15 = 0;
          do {
            cVar2 = *(char *)((long)&uStack_13f + lVar15);
            if ((cVar2 != '\t') && (cVar2 != ' ')) {
              if ((cVar2 == '\"') && (sVar7 - 10 != lVar15)) {
                lVar16 = lVar15 + 1;
                goto LAB_00208f6a;
              }
              break;
            }
            lVar15 = lVar15 + 1;
          } while (sVar7 - 9 != lVar15);
        }
        goto LAB_00208e75;
      }
      pCVar8 = (CTcSrcFile *)operator_new(0x430);
      pCVar9 = (CCharmapToUni *)operator_new(0x210);
      memset(pCVar9,0,0x210);
      (pCVar9->super_CCharmap).ref_cnt_ = 1;
      (pCVar9->super_CCharmap)._vptr_CCharmap = (_func_int **)&PTR__CCharmap_0030a8e0;
      (pCVar8->super_CTcSrcObject)._vptr_CTcSrcObject = (_func_int **)&PTR__CTcSrcFile_003140d0;
      pCVar10 = (CVmDataSource *)operator_new(0x10);
      iVar6 = 1;
      ppcVar11 = open_source(char_const*,CResLoader*,char_const*,int*,int*)::names;
    }
    pCVar10->_vptr_CVmDataSource = (_func_int **)&PTR__CVmFileSource_003141a8;
    pCVar10[1]._vptr_CVmDataSource = (_func_int **)__stream;
    pCVar8->fp_ = pCVar10;
    pCVar8->field_0x8 = 0;
    pCVar8->rem_ = 0;
    pCVar8->mapper_ = pCVar9;
    iVar5 = ucs_str_starts_with(local_148 + 2,sVar7 - 2,"#charset ",iVar6,0);
    uVar17 = 2;
    if (1 < sVar7 - 0x14 && iVar5 != 0) {
      lVar15 = 0x14;
      lVar16 = 0;
      do {
        pcVar13 = local_148 + lVar15;
        pcVar14 = local_148 + lVar15 + 1;
        if (bVar3 && bVar4) {
          pcVar13 = local_148 + lVar15 + 1;
          pcVar14 = local_148 + lVar15;
        }
        cVar2 = *pcVar14;
        if (0x7f < CONCAT11(*pcVar13,cVar2)) break;
        if ((cVar2 != '\t') && (cVar2 != ' ')) {
          if ((cVar2 == '\"') && (pcVar14 = *ppcVar11, pcVar14 != (char *)0x0)) {
            lVar15 = -lVar16;
            uVar17 = (sVar7 + lVar16) - 0x16;
            goto LAB_00208d9a;
          }
          break;
        }
        lVar1 = sVar7 + lVar16;
        lVar16 = lVar16 + -2;
        lVar15 = lVar15 + 2;
      } while (1 < lVar1 - 0x16U);
    }
LAB_00208f3e:
    fseek(__stream,uVar17 + __off,0);
    return pCVar8;
  }
  goto LAB_00208e75;
LAB_00208d9a:
  do {
    ppcVar11 = ppcVar11 + 1;
    iVar5 = ucs_str_starts_with(acStack_132 + lVar15,uVar17,pcVar14,iVar6,1);
    if ((iVar5 != 0) && (sVar7 = strlen(pcVar14), sVar7 * 2 + 2 <= uVar17)) {
      pcVar14 = local_148 + sVar7 * 2 + lVar15 + 0x16;
      pcVar12 = local_148 + sVar7 * 2 + lVar15 + 0x17;
      pcVar13 = pcVar12;
      if (!bVar3 || !bVar4) {
        pcVar13 = pcVar14;
        pcVar14 = pcVar12;
      }
      if ((*pcVar14 == '\"') && (CONCAT11(*pcVar13,0x22) < 0x80)) {
        uVar17 = (ulong)(((int)sVar7 * 2 - (int)lVar16) + 0x18);
        goto LAB_00208f3e;
      }
    }
    pcVar14 = *ppcVar11;
  } while (pcVar14 != (char *)0x0);
  uVar17 = 2;
  goto LAB_00208f3e;
  while (lVar15 = lVar15 + 1, sVar7 - 10 != lVar15) {
LAB_00208f6a:
    cVar2 = *(char *)((long)&uStack_13f + lVar15 + 1);
    if ((cVar2 == '\n') || (cVar2 == '\r')) break;
    if (cVar2 == '\"') {
      fseek(__stream,__off + lVar15 + 0xb,0);
      *(undefined1 *)((long)&uStack_13f + lVar15 + 1) = 0;
      pCVar9 = CCharmapToUni::load(res_loader,(char *)((long)&uStack_13f + lVar16));
      if (pCVar9 != (CCharmapToUni *)0x0) {
        pCVar8 = (CTcSrcFile *)operator_new(0x430);
        (pCVar8->super_CTcSrcObject)._vptr_CTcSrcObject = (_func_int **)&PTR__CTcSrcFile_003140d0;
        pCVar10 = (CVmDataSource *)operator_new(0x10);
        pCVar10->_vptr_CVmDataSource = (_func_int **)&PTR__CVmFileSource_003141a8;
        pCVar10[1]._vptr_CVmDataSource = (_func_int **)__stream;
        pCVar8->fp_ = pCVar10;
        pCVar8->field_0x8 = 0;
        pCVar8->rem_ = 0;
        pCVar8->mapper_ = pCVar9;
        return pCVar8;
      }
      *charset_error = 1;
      break;
    }
  }
LAB_00208e75:
  fseek(__stream,__off,0);
  if (default_charset == (char *)0x0) {
    pCVar9 = (CCharmapToUni *)operator_new(0x210);
    memset(pCVar9,0,0x210);
    (pCVar9->super_CCharmap).ref_cnt_ = 1;
    (pCVar9->super_CCharmap)._vptr_CCharmap = (_func_int **)&PTR__CCharmap_0030a948;
  }
  else {
    pCVar9 = CCharmapToUni::load(res_loader,default_charset);
    if (pCVar9 == (CCharmapToUni *)0x0) {
      *default_charset_error = 1;
      fclose(__stream);
      return (CTcSrcFile *)0x0;
    }
  }
  pCVar8 = (CTcSrcFile *)operator_new(0x430);
  (pCVar8->super_CTcSrcObject)._vptr_CTcSrcObject = (_func_int **)&PTR__CTcSrcFile_003140d0;
  pCVar10 = (CVmDataSource *)operator_new(0x10);
LAB_00208f08:
  pCVar10->_vptr_CVmDataSource = (_func_int **)&PTR__CVmFileSource_003141a8;
  pCVar10[1]._vptr_CVmDataSource = (_func_int **)__stream;
  pCVar8->fp_ = pCVar10;
  pCVar8->field_0x8 = 0;
  pCVar8->rem_ = 0;
  pCVar8->mapper_ = pCVar9;
  return pCVar8;
}

Assistant:

CTcSrcFile *CTcSrcFile::open_source(const char *filename,
                                    class CResLoader *res_loader,
                                    const char *default_charset,
                                    int *charset_error,
                                    int *default_charset_error)
{
    char buf[275];
    size_t siz;
    osfildef *fp;
    long startofs;
    CCharmapToUni *mapper;

    /* presume we won't find an invalid #charset directive */
    *charset_error = FALSE;

    /* presume we'll have no problem with the default character set */
    *default_charset_error = FALSE;

    /* 
     *   open the file in binary mode, so that we can scan the first few
     *   bytes to see if we can detect the character set from information
     *   at the beginning of the file 
     */
    fp = osfoprb(filename, OSFTTEXT);

    /* if we couldn't open the file, return failure */
    if (fp == 0)
        return 0;

    /* note the starting offset in the file */
    startofs = osfpos(fp);

    /* read the first few bytes of the file */
    siz = osfrbc(fp, buf, sizeof(buf));

    /* check for a 3-byte UTF-8 byte-order marker */
    if (siz >= 3  && (uchar)buf[0] == 0xEF && (uchar)buf[1] == 0xBB
        && (uchar)buf[2] == 0xBF)
    {
        char *p;
        size_t rem;
        uint skip;

        /* skip at least the three-byte marker sequence */
        skip = 3;
        
        /* 
         *   check for a #charset marker for utf-8 - this would be redundant,
         *   but we'll allow it 
         */
        p = buf + 3;
        rem = siz - 3;
        if (rem > 9 && memcmp(p, "#charset ", 9) == 0)
        {
            /* skip spaces */
            for (p += 9, rem -= 9 ; rem != 0 && (*p == ' ' || *p == '\t') ;
                 ++p, --rem);

            /* check for valid character set markers */
            if (rem >= 7 && memicmp(p, "\"utf-8\"", 7) == 0)
            {
                /* skip the whole sequence */
                skip = (p + 7) - buf;
            }
            else if (rem >= 6 && memicmp(p, "\"utf8\"", 6) == 0)
            {
                /* skip the whole sequence */
                skip = (p + 6) - buf;
            }
        }

        /* seek past the character set markers */
        osfseek(fp, startofs + skip, OSFSK_SET);

        /* return a new utf-8 decoder */
        return new CTcSrcFile(fp, new CCharmapToUniUTF8());
    }

    /* if we read at least two bytes, try auto-detecting unicode */
    if (siz >= 2)
    {
        CTcSrcFile *srcf;
        const char *const *cs_names;
        int bige;

        /* presume we won't find a byte-order marker */
        srcf = 0;
        
        /* if the first bytes are 0xFF 0xFE, it's UCS-2 low-byte first */
        if ((unsigned char)buf[0] == 0xFF && (unsigned char)buf[1] == 0xFE)
        {
            static const char *names[] = { "unicodel", "utf-16le", 0 };

            /* create a UCS-2 little-endian reader */
            srcf = new CTcSrcFile(fp, new CCharmapToUniUcs2Little());
            bige = FALSE;
            cs_names = names;
        }

        /* if the first bytes are 0xFE 0xFF, it's UCS-2 high-byte first */
        if ((unsigned char)buf[0] == 0xFE && (unsigned char)buf[1] == 0xFF)
        {
            static const char *names[] = { "unicodeb", "utf-16be", 0 };

            /* create a UCS-2 little-endian reader */
            srcf = new CTcSrcFile(fp, new CCharmapToUniUcs2Big());
            bige = TRUE;
            cs_names = names;
        }

        /* if we found the byte-order marker, we know the character set */
        if (srcf != 0)
        {
            uint skip;

            /* we at least want to skip the byte-order marker */
            skip = 2;
            
            /* check to see if we have a '#charset' directive */
            if (ucs_str_starts_with(buf + 2, siz - 2, "#charset ",
                                    bige, FALSE))
            {
                char *p;
                size_t rem;
                
                /* scan past following spaces */
                for (p = buf + 2 + 18, rem = siz - 2 - 18 ;
                     rem >= 2 && (ucs_char_eq(p, ' ', bige, FALSE)
                                  || ucs_char_eq(p, '\t', bige, FALSE)) ;
                     p += 2, rem -= 2) ;

                /* check for a '"' */
                if (rem >= 2 && ucs_char_eq(p, '"', bige, FALSE))
                {
                    const char *const *n;

                    /* skip the '"' */
                    p += 2;
                    rem -= 2;
                    
                    /* 
                     *   check for a match to any of the valid names for this
                     *   character set 
                     */
                    for (n = cs_names ; *n != 0 ; ++n)
                    {
                        /* if it's a match, stop scanning */
                        if (ucs_str_starts_with(p, rem, *n, bige, TRUE))
                        {
                            size_t l;

                            /* get the length of the name */
                            l = strlen(*n) * 2;

                            /* check for a close quote */
                            if (rem >= l + 2
                                && ucs_char_eq(p + l, '"', bige, FALSE))
                            {
                                /* skip the name and the quote */
                                p += l + 2;
                                rem -= l + 2;

                                /* skip the source text to this point */
                                skip = p - buf;

                                /* stop scanning */
                                break;
                            }
                        }
                    }
                }
            }

            /* seek just past the character set indicators */
            osfseek(fp, startofs + skip, OSFSK_SET);

            /* return the file */
            return srcf;
        }
    }

    /*
     *   It doesn't appear to use UCS-2 encoding (at least, the file
     *   doesn't start with a byte-order sensing sequence).  Check to see
     *   if the file starts with "#charset " in ASCII single-byte
     *   characters.  
     */
    if (siz >= 9 && memcmp(buf, "#charset ", 9) == 0)
    {
        char *p;
        size_t rem;
        
        /* skip the #charset string and any following spaces */
        for (p = buf + 9, rem = siz - 9 ;
             rem > 0 && (*p == ' ' || *p == '\t') ; ++p, --rem) ;

        /* make sure we're looking at a '"' */
        if (rem != 0 && *p == '"')
        {
            char *charset_name;

            /* skip the open quote */
            ++p;
            --rem;
            
            /* remember where the character set name starts */
            charset_name = p;

            /* 
             *   find the closing quote, which must occur before a CR or
             *   LF character 
             */
            for ( ; rem > 0 && *p != '"' && *p != 10 && *p != 13 ;
                 ++p, --rem) ;

            /* make sure we found a matching quote */
            if (rem != 0 && *p == '"')
            {
                /* seek just past the #charset string */
                osfseek(fp, startofs + (p - buf) + 1, OSFSK_SET);

                /* 
                 *   put a null terminator at the end of the character set
                 *   name 
                 */
                *p = '\0';

                /* create a mapper */
                mapper = CCharmapToUni::load(res_loader, charset_name);

                /* 
                 *   if that succeeded, return a reader for the mapper;
                 *   otherwise, simply proceed as though no #charset had
                 *   been present, so that we create a default mapper 
                 */
                if (mapper != 0)
                {
                    /* success - return a reader */
                    return new CTcSrcFile(fp, mapper);
                }
                else
                {
                    /* tell the caller the #charset was invalid */
                    *charset_error = TRUE;
                }
            }
        }
    }

    /* 
     *   we didn't find any sensing codes, so seek back to the start of
     *   the file 
     */
    osfseek(fp, startofs, OSFSK_SET);

    /*
     *   We couldn't identify the file's character set based on anything
     *   in the file, so create a mapper for the given default character
     *   set.  If there's not even a default character set defined, create
     *   a plain ASCII mapper.  
     */
    if (default_charset != 0)
        mapper = CCharmapToUni::load(res_loader, default_charset);
    else
        mapper = new CCharmapToUniASCII();

    /* check to see if we created a mapper */
    if (mapper != 0)
    {
        /* return a source file reader based on the mapper */
        return new CTcSrcFile(fp, mapper);
    }
    else
    {
        /* 
         *   we failed to create a mapper for the default character set -
         *   flag the problem 
         */
        *default_charset_error = TRUE;

        /* close the input file */
        osfcls(fp);

        /* return failure */
        return 0;
    }
}